

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::anon_unknown_20::twoSidedJacobiSVD<float>
               (Matrix33<float> *A,Matrix33<float> *U,Vec3<float> *S,Matrix33<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  bool bVar1;
  bool bVar2;
  float *pfVar3;
  float *__b;
  Matrix33<float> *in_RCX;
  Vec3<float> *in_RDX;
  Matrix33<float> *in_RSI;
  Matrix33<float> *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float unaff_retaddr;
  Matrix33<float> *in_stack_00000008;
  Matrix33<float> *in_stack_00000010;
  Matrix33<float> *in_stack_00000018;
  int i_3;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  bool changed;
  int numIter;
  float absTol;
  int maxIter;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  bool local_63;
  bool local_62;
  bool local_61;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_34;
  
  Matrix33<float>::makeIdentity(in_RSI);
  Matrix33<float>::makeIdentity(in_RCX);
  fVar4 = maxOffDiag<float>((Matrix33<float> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  fVar4 = in_XMM0_Da * fVar4;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    local_34 = 0;
    do {
      local_34 = local_34 + 1;
      bVar1 = (anonymous_namespace)::twoSidedJacobiRotation<float,0,1,2>
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      bVar2 = (anonymous_namespace)::twoSidedJacobiRotation<float,0,2,1>
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      local_61 = true;
      if (!bVar2) {
        local_61 = bVar1;
      }
      bVar1 = (anonymous_namespace)::twoSidedJacobiRotation<float,1,2,0>
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      local_62 = true;
      if (!bVar1) {
        local_62 = local_61;
      }
      if (local_62 == false) break;
      fVar5 = maxOffDiag<float>((Matrix33<float> *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_63 = fVar4 < fVar5 && local_34 < 0x14;
    } while (local_63);
  }
  pfVar3 = Matrix33<float>::operator[](in_RDI,0);
  in_RDX->x = *pfVar3;
  pfVar3 = Matrix33<float>::operator[](in_RDI,1);
  in_RDX->y = pfVar3[1];
  pfVar3 = Matrix33<float>::operator[](in_RDI,2);
  in_RDX->z = pfVar3[2];
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    pfVar3 = Vec3<float>::operator[](in_RDX,local_3c);
    if (*pfVar3 <= 0.0 && *pfVar3 != 0.0) {
      pfVar3 = Vec3<float>::operator[](in_RDX,local_3c);
      fVar4 = *pfVar3;
      pfVar3 = Vec3<float>::operator[](in_RDX,local_3c);
      *pfVar3 = -fVar4;
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        pfVar3 = Matrix33<float>::operator[](in_RSI,local_40);
        in_stack_ffffffffffffff94 = -pfVar3[local_3c];
        pfVar3 = Matrix33<float>::operator[](in_RSI,local_40);
        pfVar3[local_3c] = in_stack_ffffffffffffff94;
      }
    }
  }
  for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < 2 - local_44; local_48 = local_48 + 1) {
      pfVar3 = Vec3<float>::operator[](in_RDX,local_48);
      fVar4 = *pfVar3;
      pfVar3 = Vec3<float>::operator[](in_RDX,local_48 + 1);
      if (fVar4 < *pfVar3) {
        pfVar3 = Vec3<float>::operator[](in_RDX,local_48);
        __b = Vec3<float>::operator[](in_RDX,local_48 + 1);
        std::swap<float>(pfVar3,__b);
        swapColumns<float>((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff94,fVar4),
                           (int)((ulong)pfVar3 >> 0x20),(int)pfVar3);
        swapColumns<float>((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff94,fVar4),
                           (int)((ulong)pfVar3 >> 0x20),(int)pfVar3);
      }
    }
  }
  if ((in_R8B & 1) != 0) {
    fVar4 = Matrix33<float>::determinant(in_RSI);
    if (fVar4 < 0.0) {
      for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
        pfVar3 = Matrix33<float>::operator[](in_RSI,local_4c);
        fVar4 = pfVar3[2];
        pfVar3 = Matrix33<float>::operator[](in_RSI,local_4c);
        pfVar3[2] = -fVar4;
      }
      in_RDX->z = -in_RDX->z;
    }
    fVar4 = Matrix33<float>::determinant(in_RCX);
    if (fVar4 < 0.0) {
      for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
        pfVar3 = Matrix33<float>::operator[](in_RCX,local_50);
        fVar4 = pfVar3[2];
        pfVar3 = Matrix33<float>::operator[](in_RCX,local_50);
        pfVar3[2] = -fVar4;
      }
      in_RDX->z = -in_RDX->z;
    }
  }
  return;
}

Assistant:

void
twoSidedJacobiSVD (
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>  A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&     S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>& V,
    const T                                tol,
    const bool                             forcePositiveDeterminant)
{
    // The two-sided Jacobi SVD works by repeatedly zeroing out
    // off-diagonal entries of the matrix, 2 at a time.  Basically,
    // we can take our 3x3 matrix,
    //    [* * *]
    //    [* * *]
    //    [* * *]
    // and use a pair of orthogonal transforms to zero out, say, the
    // pair of entries (0, 1) and (1, 0):
    //  [ c1 s1  ] [* * *] [ c2 s2  ]   [*   *]
    //  [-s1 c1  ] [* * *] [-s2 c2  ] = [  * *]
    //  [       1] [* * *] [       1]   [* * *]
    // When we go to zero out the next pair of entries (say, (0, 2) and (2, 0))
    // then we don't expect those entries to stay 0:
    //  [ c1 s1  ] [*   *] [ c2 s2  ]   [* *  ]
    //  [-s1 c1  ] [  * *] [-s2 c2  ] = [* * *]
    //  [       1] [* * *] [       1]   [  * *]
    // However, if we keep doing this, we'll find that the off-diagonal entries
    // converge to 0 fairly quickly (convergence should be roughly cubic).  The
    // result is a diagonal A matrix and a bunch of orthogonal transforms:
    //               [* * *]                [*    ]
    //  L1 L2 ... Ln [* * *] Rn ... R2 R1 = [  *  ]
    //               [* * *]                [    *]
    //  ------------ ------- ------------   -------
    //      U^T         A         V            S
    // This turns out to be highly accurate because (1) orthogonal transforms
    // are extremely stable to compute and apply (this is why QR factorization
    // works so well, FWIW) and because (2) by applying everything to the original
    // matrix A instead of computing (A^T * A) we avoid any precision loss that
    // would result from that.
    U.makeIdentity ();
    V.makeIdentity ();

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiag (A); // Tolerance is in terms of the maximum
    if (absTol != 0)          // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            bool changed = twoSidedJacobiRotation<T, 0, 1, 2> (A, U, V, tol);
            changed      = twoSidedJacobiRotation<T, 0, 2, 1> (A, U, V, tol) ||
                      changed;
            changed = twoSidedJacobiRotation<T, 1, 2, 0> (A, U, V, tol) ||
                      changed;
            if (!changed) break;
        } while (maxOffDiag (A) > absTol && numIter < maxIter);
    }

    // The off-diagonal entries are (effectively) 0, so whatever's left on the
    // diagonal are the singular values:
    S.x = A[0][0];
    S.y = A[1][1];
    S.z = A[2][2];

    // Nothing thus far has guaranteed that the singular values are positive,
    // so let's go back through and flip them if not (since by contract we are
    // supposed to return all positive SVs):
    for (int i = 0; i < 3; ++i)
    {
        if (S[i] < 0)
        {
            // If we flip S[i], we need to flip the corresponding column of U
            // (we could also pick V if we wanted; it doesn't really matter):
            S[i] = -S[i];
            for (int j = 0; j < 3; ++j)
                U[j][i] = -U[j][i];
        }
    }

    // Order the singular values from largest to smallest; this requires
    // exactly two passes through the data using bubble sort:
    for (int i = 0; i < 2; ++i)
    {
        for (int j = 0; j < (2 - i); ++j)
        {
            // No absolute values necessary since we already ensured that
            // they're positive:
            if (S[j] < S[j + 1])
            {
                // If we swap singular values we also have to swap
                // corresponding columns in U and V:
                std::swap (S[j], S[j + 1]);
                swapColumns (U, j, j + 1);
                swapColumns (V, j, j + 1);
            }
        }
    }

    if (forcePositiveDeterminant)
    {
        // We want to guarantee that the returned matrices always have positive
        // determinant.  We can do this by adding the appropriate number of
        // matrices of the form:
        //       [ 1       ]
        //  L =  [    1    ]
        //       [      -1 ]
        // Note that L' = L and L*L = Identity.  Thus we can add:
        //   U*L*L*S*V = (U*L)*(L*S)*V
        // if U has a negative determinant, and
        //   U*S*L*L*V = U*(S*L)*(L*V)
        // if V has a neg. determinant.
        if (U.determinant () < 0)
        {
            for (int i = 0; i < 3; ++i)
                U[i][2] = -U[i][2];
            S.z = -S.z;
        }

        if (V.determinant () < 0)
        {
            for (int i = 0; i < 3; ++i)
                V[i][2] = -V[i][2];
            S.z = -S.z;
        }
    }
}